

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int arkStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int in_ESI;
  long in_RDI;
  int retval;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ARKodeButcherTable in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  long local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    if (in_ESI < 1) {
      *(undefined4 *)(local_20 + 0x60) = 4;
    }
    else {
      *(int *)(local_20 + 0x60) = in_ESI;
    }
    *(undefined4 *)(local_20 + 0x6c) = 0;
    *(undefined4 *)(local_20 + 0x68) = 0;
    *(undefined4 *)(local_20 + 100) = 0;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)(local_20 + 0x70),(sunindextype *)&stack0xffffffffffffffd0,
               (sunindextype *)&stack0xffffffffffffffd8);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffd0);
    *(undefined8 *)(local_20 + 0x70) = 0;
    *(long *)(in_RDI + 0x370) = *(long *)(in_RDI + 0x370) - (long)in_stack_ffffffffffffffd0;
    *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) - (long)in_stack_ffffffffffffffd8;
    ARKodeButcherTable_Space
              (*(ARKodeButcherTable *)(local_20 + 0x78),(sunindextype *)&stack0xffffffffffffffd0,
               (sunindextype *)&stack0xffffffffffffffd8);
    ARKodeButcherTable_Free(in_stack_ffffffffffffffd0);
    *(undefined8 *)(local_20 + 0x78) = 0;
    *(long *)(in_RDI + 0x370) = *(long *)(in_RDI + 0x370) - (long)in_stack_ffffffffffffffd0;
    *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) - (long)in_stack_ffffffffffffffd8;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) { step_mem->q = Q_DEFAULT; }
  else { step_mem->q = ord; }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->istage = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return (ARK_SUCCESS);
}